

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O1

bool tinyusdz::tydra::detail::FlattenSkelNode
               (SkelNode *node,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  SkelNode *pSVar1;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *restTransforms_00;
  bool bVar2;
  long lVar3;
  matrix4d *pmVar4;
  pointer pmVar5;
  SkelNode *node_00;
  ulong uVar6;
  bool bVar7;
  byte bVar8;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *local_38;
  
  bVar8 = 0;
  uVar6 = (ulong)node->joint_id;
  if (uVar6 < (ulong)((long)(joints->
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(joints->
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_50 = 0;
    local_48 = 0;
    local_58 = &local_48;
    local_38 = restTransforms;
    ::std::__cxx11::string::_M_assign((string *)&local_58);
    ::std::__cxx11::string::operator=
              ((string *)
               ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar6),(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    local_58 = &local_48;
    local_50 = 0;
    local_48 = 0;
    ::std::__cxx11::string::_M_assign((string *)&local_58);
    ::std::__cxx11::string::operator=
              ((string *)
               ((jointNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar6),(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    restTransforms_00 = local_38;
    pmVar4 = &node->bind_transform;
    pmVar5 = (bindTransforms->
             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar6;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pmVar5->m[0][0] = pmVar4->m[0][0];
      pmVar4 = (matrix4d *)((long)pmVar4 + (ulong)bVar8 * -0x10 + 8);
      pmVar5 = (pointer)((long)pmVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    pmVar4 = &node->rest_transform;
    pmVar5 = (local_38->
             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar6;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pmVar5->m[0][0] = pmVar4->m[0][0];
      pmVar4 = (matrix4d *)((long)pmVar4 + (ulong)bVar8 * -0x10 + 8);
      pmVar5 = (pointer)((long)pmVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    node_00 = (node->children).
              super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (node->children).
             super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = node_00 == pSVar1;
    if ((!bVar7) &&
       (bVar2 = FlattenSkelNode(node_00,joints,jointNames,bindTransforms,local_38,err), bVar2)) {
      do {
        node_00 = node_00 + 1;
        bVar7 = node_00 == pSVar1;
        if (bVar7) {
          return bVar7;
        }
        bVar2 = FlattenSkelNode(node_00,joints,jointNames,bindTransforms,restTransforms_00,err);
      } while (bVar2);
    }
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool FlattenSkelNode(const SkelNode &node,
  std::vector<value::token> &joints,
  std::vector<value::token> &jointNames,
  std::vector<value::matrix4d> &bindTransforms,
  std::vector<value::matrix4d> &restTransforms, std::string *err) {

  size_t idx = size_t(node.joint_id);
  if (idx >= joints.size()) {
    if (err) {
      (*err) += "joint_id out-of-bounds.";
    }
    return false;
  }

  joints[idx] = value::token(node.joint_path);
  jointNames[idx] = value::token(node.joint_name);
  bindTransforms[idx] = node.bind_transform;
  restTransforms[idx] = node.rest_transform;

  for (const auto &child : node.children) {
    if (!FlattenSkelNode(child, joints, jointNames, bindTransforms, restTransforms, err)) {
      return false;
    }
  }

  return true;
}